

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdafx.h
# Opt level: O2

JsErrorCode __thiscall AutoString::Initialize(AutoString *this,JsValueRef value)

{
  code *pcVar1;
  JsValueRef pvVar2;
  JsErrorCode JVar3;
  char *pcVar4;
  PAL_FILE *pPVar5;
  JsValueType local_44;
  JsValueRef pvStack_40;
  JsValueType type;
  size_t writtenLength;
  JsValueRef strValue;
  size_t length;
  
  this->errorCode = JsNoError;
  (*ChakraRTInterface::m_jsApiHooks.pfJsrtGetValueType)(value,&local_44);
  if (local_44 == JsString) {
    JVar3 = this->errorCode;
    writtenLength = (size_t)value;
  }
  else {
    JVar3 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtConvertValueToString)
                      (value,(JsValueRef *)&writtenLength);
    this->errorCode = JVar3;
  }
  strValue = (JsValueRef)0x0;
  if (JVar3 == JsNoError) {
    JVar3 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtCopyString)
                      ((JsValueRef)writtenLength,(char *)0x0,0,(size_t *)&strValue);
    pvVar2 = strValue;
    this->errorCode = JVar3;
    if (JVar3 == JsNoError) {
      pcVar4 = (char *)malloc((long)strValue + 1);
      this->data = pcVar4;
      pvStack_40 = (JsValueRef)0x0;
      JVar3 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtCopyString)
                        ((JsValueRef)writtenLength,pcVar4,(size_t)pvVar2,
                         (size_t *)&stack0xffffffffffffffc0);
      this->errorCode = JVar3;
      if (JVar3 == JsNoError) {
        if (strValue != pvStack_40) {
          pPVar5 = PAL_get_stderr(0);
          PAL_fprintf(pPVar5,"ASSERTION (%s, line %d) %s %s\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/bin/ch/stdafx.h"
                      ,0xe0,"length == writtenLength","Inconsistent length in utf8 encoding");
          pPVar5 = PAL_get_stderr(0);
          PAL_fflush(pPVar5);
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        this->data[(long)strValue] = '\0';
        this->length = (size_t)strValue;
        JVar3 = this->errorCode;
      }
    }
  }
  return JVar3;
}

Assistant:

JsErrorCode Initialize(JsValueRef value)
    {
        errorCode = JsNoError;
        JsValueRef strValue;
        JsValueType type;
        ChakraRTInterface::JsGetValueType(value, &type);
        if (type != JsString)
        {
            errorCode = ChakraRTInterface::JsConvertValueToString(value, &strValue);
        }
        else
        {
            strValue = value;
        }
        size_t length = 0;
        if (errorCode == JsNoError)
        {
            errorCode = ChakraRTInterface::JsCopyString(strValue, nullptr, 0, &length);
            if (errorCode == JsNoError)
            {
                data = (char*)malloc((length + 1) * sizeof(char));
                size_t writtenLength = 0;
                errorCode = ChakraRTInterface::JsCopyString(strValue, data, length, &writtenLength);
                if (errorCode == JsNoError)
                {
                    AssertMsg(length == writtenLength, "Inconsistent length in utf8 encoding");
                }
            }
        }
        if (errorCode == JsNoError)
        {
            *(data + length) = char(0);
            this->length = length;
        }
        return errorCode;
    }